

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

archive_read_filter * get_filter(archive *_a,int n)

{
  archive_read_filter *paVar1;
  archive_read_filter *f;
  
  paVar1 = (archive_read_filter *)_a;
  if (_a == (archive *)0x0 || n != -1) {
    if (n < 0) {
      return (archive_read_filter *)0x0;
    }
    if (n != 0 && _a != (archive *)0x0) {
      do {
        _a = (archive *)((archive_read_filter *)_a)->upstream;
        if ((uint)n < 2) {
          return (archive_read_filter *)_a;
        }
        n = n - 1;
      } while ((archive_read_filter *)_a != (archive_read_filter *)0x0);
    }
  }
  else {
    do {
      _a = (archive *)paVar1;
      paVar1 = ((archive_read_filter *)_a)->upstream;
    } while (((archive_read_filter *)_a)->upstream != (archive_read_filter *)0x0);
  }
  return (archive_read_filter *)_a;
}

Assistant:

static struct archive_read_filter *
get_filter(struct archive *_a, int n)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *f = a->filter;
	/* We use n == -1 for 'the last filter', which is always the
	 * client proxy. */
	if (n == -1 && f != NULL) {
		struct archive_read_filter *last = f;
		f = f->upstream;
		while (f != NULL) {
			last = f;
			f = f->upstream;
		}
		return (last);
	}
	if (n < 0)
		return NULL;
	while (n > 0 && f != NULL) {
		f = f->upstream;
		--n;
	}
	return (f);
}